

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLogLog>::
operator()(RectRenderer<ImPlot::GetterHeatmap<unsigned_long_long>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int iVar12;
  uint uVar13;
  GetterHeatmap<unsigned_long_long> *pGVar14;
  TransformerLogLog *pTVar15;
  ImPlotPlot *pIVar16;
  ImDrawVert *pIVar17;
  ImDrawIdx *pIVar18;
  ImVec2 IVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  ImVec2 IVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ImPlotContext *pIVar26;
  ImPlotContext *pIVar27;
  bool bVar28;
  bool bVar29;
  ImDrawIdx IVar30;
  ImU32 IVar31;
  float fVar32;
  float fVar33;
  ImVec2 IVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  double dVar39;
  double dVar40;
  ImVec2 IVar41;
  undefined1 auVar42 [16];
  float fVar43;
  double dVar44;
  double dVar45;
  
  pGVar14 = this->Getter;
  auVar36._0_8_ = (double)CONCAT44(0x43300000,(int)pGVar14->Values[prim]);
  auVar36._8_4_ = (int)(pGVar14->Values[prim] >> 0x20);
  auVar36._12_4_ = 0x45300000;
  dVar45 = (pGVar14->HalfSize).x;
  dVar39 = (double)(prim % pGVar14->Cols) * pGVar14->Width + pGVar14->XRef + dVar45;
  dVar44 = (pGVar14->HalfSize).y;
  dVar40 = ((double)(prim / pGVar14->Cols) * pGVar14->Height + dVar44) * pGVar14->YDir +
           pGVar14->YRef;
  fVar32 = (float)((((auVar36._8_8_ - 1.9342813113834067e+25) + (auVar36._0_8_ - 4503599627370496.0)
                    ) - pGVar14->ScaleMin) / (pGVar14->ScaleMax - pGVar14->ScaleMin));
  fVar43 = 1.0;
  if (fVar32 <= 1.0) {
    fVar43 = fVar32;
  }
  IVar31 = ImPlotColormapData::LerpTable
                     (&GImPlot->ColormapData,(GImPlot->Style).Colormap,
                      (float)(~-(uint)(fVar32 < 0.0) & (uint)fVar43));
  pIVar26 = GImPlot;
  pTVar15 = this->Transformer;
  dVar20 = log10((dVar39 - dVar45) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar16 = pIVar26->CurrentPlot;
  dVar2 = pIVar26->LogDenX;
  dVar3 = (pIVar16->XAxis).Range.Min;
  dVar4 = (pIVar16->XAxis).Range.Max;
  dVar21 = log10((dVar40 - dVar44) / pIVar16->YAxis[pTVar15->YAxis].Range.Min);
  pIVar27 = GImPlot;
  iVar12 = pTVar15->YAxis;
  pIVar16 = pIVar26->CurrentPlot;
  dVar5 = pIVar26->My[iVar12];
  dVar6 = pIVar26->LogDenY[iVar12];
  pTVar15 = this->Transformer;
  dVar7 = pIVar16->YAxis[iVar12].Range.Min;
  dVar8 = pIVar16->YAxis[iVar12].Range.Max;
  fVar43 = pIVar26->PixelRange[iVar12].Min.x;
  fVar32 = pIVar26->PixelRange[iVar12].Min.y;
  dVar9 = (pIVar16->XAxis).Range.Min;
  dVar10 = pIVar26->Mx;
  dVar22 = log10((dVar39 + dVar45) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar16 = pIVar27->CurrentPlot;
  dVar45 = pIVar27->LogDenX;
  dVar39 = (pIVar16->XAxis).Range.Min;
  dVar11 = (pIVar16->XAxis).Range.Max;
  dVar44 = log10((dVar40 + dVar44) / pIVar16->YAxis[pTVar15->YAxis].Range.Min);
  if (IVar31 < 0x1000000) {
    bVar29 = false;
  }
  else {
    auVar35._8_8_ = dVar21;
    auVar35._0_8_ = dVar22;
    auVar24._8_4_ = SUB84(dVar6,0);
    auVar24._0_8_ = dVar45;
    auVar24._12_4_ = (int)((ulong)dVar6 >> 0x20);
    auVar36 = divpd(auVar35,auVar24);
    iVar12 = pTVar15->YAxis;
    pIVar16 = pIVar27->CurrentPlot;
    dVar39 = pIVar27->Mx *
             (((double)(float)auVar36._0_8_ * (dVar11 - dVar39) + dVar39) -
             (pIVar16->XAxis).Range.Min) + (double)pIVar27->PixelRange[iVar12].Min.x;
    dVar40 = dVar5 * (((double)(float)auVar36._8_8_ * (dVar8 - dVar7) + dVar7) - dVar7) +
             (double)fVar32;
    auVar42._8_8_ = dVar44;
    auVar42._0_8_ = dVar20;
    auVar25._8_4_ = SUB84(pIVar27->LogDenY[iVar12],0);
    auVar25._0_8_ = dVar2;
    auVar25._12_4_ = (int)((ulong)pIVar27->LogDenY[iVar12] >> 0x20);
    auVar36 = divpd(auVar42,auVar25);
    fVar32 = (float)dVar39;
    fVar33 = (float)dVar40;
    dVar45 = pIVar16->YAxis[iVar12].Range.Min;
    dVar44 = dVar10 * (((double)(float)auVar36._0_8_ * (dVar4 - dVar3) + dVar3) - dVar9) +
             (double)fVar43;
    dVar45 = pIVar27->My[iVar12] *
             (((double)(float)auVar36._8_8_ * (pIVar16->YAxis[iVar12].Range.Max - dVar45) + dVar45)
             - dVar45) + (double)pIVar27->PixelRange[iVar12].Min.y;
    fVar37 = (float)dVar44;
    fVar38 = (float)dVar45;
    fVar43 = fVar33;
    if (fVar38 <= fVar33) {
      fVar43 = fVar38;
    }
    bVar28 = false;
    bVar29 = false;
    if ((fVar43 < (cull_rect->Max).y) &&
       (fVar43 = (float)(~-(uint)(fVar38 <= fVar33) & (uint)fVar38 |
                        (uint)fVar33 & -(uint)(fVar38 <= fVar33)), pfVar1 = &(cull_rect->Min).y,
       bVar29 = bVar28, *pfVar1 <= fVar43 && fVar43 != *pfVar1)) {
      fVar43 = fVar37;
      if (fVar32 <= fVar37) {
        fVar43 = fVar32;
      }
      if ((fVar43 < (cull_rect->Max).x) &&
         (fVar43 = (float)(~-(uint)(fVar32 <= fVar37) & (uint)fVar32 |
                          -(uint)(fVar32 <= fVar37) & (uint)fVar37),
         (cull_rect->Min).x <= fVar43 && fVar43 != (cull_rect->Min).x)) {
        IVar41.x = (float)dVar44;
        IVar41.y = (float)dVar40;
        IVar34.x = (float)dVar39;
        IVar34.y = (float)dVar45;
        DrawList->_VtxWritePtr->pos = IVar41;
        DrawList->_VtxWritePtr->uv = *uv;
        pIVar17 = DrawList->_VtxWritePtr;
        pIVar17->col = IVar31;
        IVar23.y = fVar38;
        IVar23.x = fVar37;
        pIVar17[1].pos = IVar23;
        pIVar17[1].uv = *uv;
        pIVar17 = DrawList->_VtxWritePtr;
        pIVar17[1].col = IVar31;
        pIVar17[2].pos = IVar34;
        DrawList->_VtxWritePtr[2].uv = *uv;
        pIVar17 = DrawList->_VtxWritePtr;
        pIVar17[2].col = IVar31;
        IVar19.y = fVar33;
        IVar19.x = fVar32;
        pIVar17[3].pos = IVar19;
        pIVar17[3].uv = *uv;
        pIVar17 = DrawList->_VtxWritePtr;
        pIVar17[3].col = IVar31;
        DrawList->_VtxWritePtr = pIVar17 + 4;
        uVar13 = DrawList->_VtxCurrentIdx;
        pIVar18 = DrawList->_IdxWritePtr;
        IVar30 = (ImDrawIdx)uVar13;
        *pIVar18 = IVar30;
        pIVar18[1] = IVar30 + 1;
        pIVar18[2] = IVar30 + 3;
        pIVar18[3] = IVar30 + 1;
        pIVar18[4] = IVar30 + 2;
        pIVar18[5] = IVar30 + 3;
        DrawList->_IdxWritePtr = pIVar18 + 6;
        DrawList->_VtxCurrentIdx = uVar13 + 4;
        bVar29 = true;
      }
    }
  }
  return bVar29;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        RectInfo rect = Getter(prim);
        ImVec2 P1 = Transformer(rect.Min);
        ImVec2 P2 = Transformer(rect.Max);

        if ((rect.Color & IM_COL32_A_MASK) == 0 || !cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;

        DrawList._VtxWritePtr[0].pos   = P1;
        DrawList._VtxWritePtr[0].uv    = uv;
        DrawList._VtxWritePtr[0].col   = rect.Color;
        DrawList._VtxWritePtr[1].pos.x = P1.x;
        DrawList._VtxWritePtr[1].pos.y = P2.y;
        DrawList._VtxWritePtr[1].uv    = uv;
        DrawList._VtxWritePtr[1].col   = rect.Color;
        DrawList._VtxWritePtr[2].pos   = P2;
        DrawList._VtxWritePtr[2].uv    = uv;
        DrawList._VtxWritePtr[2].col   = rect.Color;
        DrawList._VtxWritePtr[3].pos.x = P2.x;
        DrawList._VtxWritePtr[3].pos.y = P1.y;
        DrawList._VtxWritePtr[3].uv    = uv;
        DrawList._VtxWritePtr[3].col   = rect.Color;
        DrawList._VtxWritePtr += 4;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 2);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr   += 6;
        DrawList._VtxCurrentIdx += 4;
        return true;
    }